

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

GCObject * luaC_newobj(lua_State *L,int tt,size_t sz,GCObject **list,int offset)

{
  global_State *pgVar1;
  void *pvVar2;
  GCObject **ppGVar3;
  long lVar4;
  
  pgVar1 = L->l_G;
  pvVar2 = luaM_realloc_(L,(void *)0x0,(ulong)(tt & 0xf),sz);
  ppGVar3 = &pgVar1->allgc;
  if (list != (GCObject **)0x0) {
    ppGVar3 = list;
  }
  lVar4 = (long)offset;
  *(byte *)((long)pvVar2 + lVar4 + 9) = pgVar1->currentwhite & 3;
  *(char *)((long)pvVar2 + lVar4 + 8) = (char)tt;
  *(GCObject **)((long)pvVar2 + lVar4) = *ppGVar3;
  *ppGVar3 = (GCObject *)((long)pvVar2 + lVar4);
  return (GCObject *)((long)pvVar2 + lVar4);
}

Assistant:

GCObject *luaC_newobj (lua_State *L, int tt, size_t sz, GCObject **list,
                       int offset) {
  global_State *g = G(L);
  char *raw = cast(char *, luaM_newobject(L, novariant(tt), sz));
  GCObject *o = obj2gco(raw + offset);
  if (list == NULL)
    list = &g->allgc;  /* standard list for collectable objects */
  gch(o)->marked = luaC_white(g);
  gch(o)->tt = tt;
  gch(o)->next = *list;
  *list = o;
  return o;
}